

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator/(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  int s;
  int iVar1;
  unsigned_long v_00;
  sc_digit ud [3];
  
  s = v->sgn;
  if (u < 1) {
    if (u == 0) goto LAB_001d59e5;
    v_00 = -u;
    if ((ulong)u < 0x8000000000000001) {
      v_00 = 0x8000000000000000;
    }
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
    v_00 = u;
  }
  if (s != 0) {
    from_uint<unsigned_long>(3,ud,v_00);
    div_signed_friend(__return_storage_ptr__,(uint)(s == iVar1) * 2 + -1,0x40,3,ud,v->nbits,
                      v->ndigits,v->digit);
    return __return_storage_ptr__;
  }
LAB_001d59e5:
  div_by_zero<int>(s);
  sc_length_param::sc_length_param((sc_length_param *)ud);
  sc_signed::sc_signed(__return_storage_ptr__,ud[0]);
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator/(long u, const sc_signed& v)
{

  small_type s = mul_signs(v.sgn, get_sign(u));

  if (s == SC_ZERO) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2
  }

  CONVERT_LONG_2(u);

  // other cases
  return div_signed_friend(s, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.nbits, v.ndigits, v.digit);

}